

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_block_statemach(connectdata *conn)

{
  imap_conn *imapc;
  CURLcode result;
  connectdata *conn_local;
  
  imapc._4_4_ = CURLE_OK;
  while ((conn->proto).imapc.state != IMAP_STOP && imapc._4_4_ == CURLE_OK) {
    imapc._4_4_ = Curl_pp_statemach(&(conn->proto).ftpc.pp,true);
  }
  return imapc._4_4_;
}

Assistant:

static CURLcode imap_block_statemach(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;

  while(imapc->state != IMAP_STOP && !result)
    result = Curl_pp_statemach(&imapc->pp, TRUE);

  return result;
}